

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LennardJonesInteractionType.hpp
# Opt level: O0

void __thiscall
OpenMD::LennardJonesInteractionType::LennardJonesInteractionType
          (LennardJonesInteractionType *this,RealType mySigma,RealType myEpsilon)

{
  NonBondedInteractionType *in_RDI;
  _func_int **in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  
  NonBondedInteractionType::NonBondedInteractionType(in_RDI);
  in_RDI->_vptr_NonBondedInteractionType = (_func_int **)&PTR__LennardJonesInteractionType_005005b0;
  NonBondedInteractionType::setLennardJones(in_RDI);
  in_RDI[1]._vptr_NonBondedInteractionType = in_XMM0_Qa;
  in_RDI[1].nbitp.is_LennardJones = (bool)(char)in_XMM1_Qa;
  in_RDI[1].nbitp.is_Morse = (bool)(char)((ulong)in_XMM1_Qa >> 8);
  in_RDI[1].nbitp.is_MAW = (bool)(char)((ulong)in_XMM1_Qa >> 0x10);
  in_RDI[1].nbitp.is_EAMTable = (bool)(char)((ulong)in_XMM1_Qa >> 0x18);
  in_RDI[1].nbitp.is_EAMZhou = (bool)(char)((ulong)in_XMM1_Qa >> 0x20);
  in_RDI[1].nbitp.is_EAMOxides = (bool)(char)((ulong)in_XMM1_Qa >> 0x28);
  in_RDI[1].nbitp.is_SC = (bool)(char)((ulong)in_XMM1_Qa >> 0x30);
  in_RDI[1].nbitp.is_RepulsivePower = (bool)(char)((ulong)in_XMM1_Qa >> 0x38);
  return;
}

Assistant:

LennardJonesInteractionType(RealType mySigma, RealType myEpsilon) {
      setLennardJones();
      sigma   = mySigma;
      epsilon = myEpsilon;
    }